

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_cpc.cpp
# Opt level: O2

void dirSAVECDTCode(path *cdtname)

{
  aint aVar1;
  aint aVar2;
  undefined8 uVar3;
  aint buflen;
  bool bVar4;
  word in_stack_ffffffffffffffa0;
  undefined6 uStack_5e;
  aint args [3];
  bool opt [3];
  string tfname;
  
  bVar4 = anyComma(&lp);
  if (bVar4) {
    GetDelimitedString_abi_cxx11_(&tfname,&lp);
    bVar4 = anyComma(&lp);
    if (bVar4) {
      args[2] = -1;
      args[0] = 0;
      args[1] = 0;
      opt[2] = true;
      opt[0] = false;
      opt[1] = false;
      bVar4 = getIntArguments<3>(&lp,&args,&opt);
      aVar1 = args[2];
      uVar3 = args._0_8_;
      aVar2 = args[0];
      buflen = args[1];
      if (args[1] + args[0] < 0x10001 &&
          (0xffff0000 < args[1] - 0x10000U && (-1 < args[0] && bVar4))) {
        CDTUtil::getContigRAM((CDTUtil *)&stack0xffffffffffffffa0,args[0],args[1]);
        if (aVar1 < 0) {
          aVar1 = aVar2;
        }
        CDTUtil::writeTapeFile
                  (cdtname,&tfname,'\x02',(byte *)CONCAT62(uStack_5e,in_stack_ffffffffffffffa0),
                   buflen,(word)uVar3,(word)aVar1,in_stack_ffffffffffffffa0);
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                  ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                   &stack0xffffffffffffffa0);
      }
      else {
        Error("[SAVECDT] Invalid args. SAVECDT CODE <cdtname>,<name>,<start>,<length>[,<customstartaddress>]"
              ,lp,SUPPRESS);
      }
    }
    else {
      Error("[SAVECDT] Invalid args. SAVECDT CODE <cdtname>,<name>,<start>,<length>[,<customstartaddress>]"
            ,lp,SUPPRESS);
    }
    std::__cxx11::string::~string((string *)&tfname);
    return;
  }
  Error("[SAVECDT] Invalid args. SAVECDT CODE <cdtname>,<name>,<start>,<length>[,<customstartaddress>]"
        ,lp,SUPPRESS);
  return;
}

Assistant:

static void dirSAVECDTCode(const std::filesystem::path & cdtname) {
	constexpr const char* argerr = "[SAVECDT] Invalid args. SAVECDT CODE <cdtname>,<name>,<start>,<length>[,<customstartaddress>]";

	if (!anyComma(lp)) {
		Error(argerr, lp, SUPPRESS); return;
	}

	const std::string tfname = GetDelimitedString(lp);
	if (!anyComma(lp)) {
		Error(argerr, lp, SUPPRESS); return;
	}

	aint args[] = { /*0:start*/ 0, /*1:length*/ 0, /*2:customStart*/ -1 };
	bool opt[] = { false, false, true };
	if (!getIntArguments<3>(lp, args, opt) || args[0] < 0 || args[1] < 1 || 0x10000 <= args[1] || 0x10000 < (args[0]+args[1])) {
		Error(argerr, lp, SUPPRESS); return;
	}

	SaveCDT_Code(cdtname, tfname, args[0], args[1], args[2]);
}